

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

Value __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::makeArray
          (Interpreter *this,
          vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
          *v)

{
  anon_union_8_3_4e909c26_for_v aVar1;
  Value VVar2;
  Value r;
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  *in_stack_00000038;
  Interpreter *in_stack_00000040;
  
  aVar1.h = &(anonymous_namespace)::Interpreter::
             makeHeap<jsonnet::internal::(anonymous_namespace)::HeapArray,std::vector<jsonnet::internal::(anonymous_namespace)::HeapThunk*,std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk*>>const&>
                       (in_stack_00000040,in_stack_00000038)->super_HeapEntity;
  VVar2.v.h = aVar1.h;
  VVar2._0_8_ = 0x10;
  return VVar2;
}

Assistant:

Value makeArray(const std::vector<HeapThunk *> &v)
    {
        Value r;
        r.t = Value::ARRAY;
        r.v.h = makeHeap<HeapArray>(v);
        return r;
    }